

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if_conversion.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::IfConversion::SplatCondition
          (IfConversion *this,Vector *vec_data_ty,uint32_t cond,InstructionBuilder *builder)

{
  uint32_t uVar1;
  IRContext *this_00;
  TypeManager *this_01;
  Instruction *this_02;
  allocator<unsigned_int> local_a9;
  undefined1 local_a8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> ids;
  undefined1 local_88 [4];
  uint32_t bool_vec_id;
  Vector bool_vec_ty;
  Bool bool_ty;
  InstructionBuilder *builder_local;
  Vector *pVStack_18;
  uint32_t cond_local;
  Vector *vec_data_ty_local;
  IfConversion *this_local;
  
  builder_local._4_4_ = cond;
  pVStack_18 = vec_data_ty;
  vec_data_ty_local = (Vector *)this;
  analysis::Bool::Bool((Bool *)&bool_vec_ty.count_);
  uVar1 = analysis::Vector::element_count(pVStack_18);
  analysis::Vector::Vector((Vector *)local_88,(Type *)&bool_vec_ty.count_,uVar1);
  this_00 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_type_mgr(this_00);
  ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ =
       analysis::TypeManager::GetTypeInstruction(this_01,(Type *)local_88);
  uVar1 = analysis::Vector::element_count(pVStack_18);
  std::allocator<unsigned_int>::allocator(&local_a9);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8,(ulong)uVar1,
             (value_type_conflict *)((long)&builder_local + 4),&local_a9);
  std::allocator<unsigned_int>::~allocator(&local_a9);
  this_02 = InstructionBuilder::AddCompositeConstruct
                      (builder,ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
  uVar1 = opt::Instruction::result_id(this_02);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
  analysis::Vector::~Vector((Vector *)local_88);
  analysis::Bool::~Bool((Bool *)&bool_vec_ty.count_);
  return uVar1;
}

Assistant:

uint32_t IfConversion::SplatCondition(analysis::Vector* vec_data_ty,
                                      uint32_t cond,
                                      InstructionBuilder* builder) {
  // If the data inputs to OpSelect are vectors, the condition for
  // OpSelect must be a boolean vector with the same number of
  // components. So splat the condition for the branch into a vector
  // type.
  analysis::Bool bool_ty;
  analysis::Vector bool_vec_ty(&bool_ty, vec_data_ty->element_count());
  uint32_t bool_vec_id =
      context()->get_type_mgr()->GetTypeInstruction(&bool_vec_ty);
  std::vector<uint32_t> ids(vec_data_ty->element_count(), cond);
  return builder->AddCompositeConstruct(bool_vec_id, ids)->result_id();
}